

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O3

Publication * __thiscall
helics::ValueFederateManager::getPublication(ValueFederateManager *this,int index)

{
  undefined1 *puVar1;
  handle pubHandle;
  handle local_28;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(&local_28,&this->publications);
  puVar1 = invalidPubNC;
  if ((-1 < index) && (index < (int)((local_28.data)->dataStorage).csize)) {
    puVar1 = (undefined1 *)
             (((local_28.data)->dataStorage).dataptr[(uint)index >> 5] + (index & 0x1f));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28.m_handle_lock);
  return (Publication *)puVar1;
}

Assistant:

Publication& ValueFederateManager::getPublication(int index)
{
    auto pubHandle = publications.lock();
    if (isValidIndex(index, *pubHandle)) {
        return (*pubHandle)[index];
    }
    return invalidPubNC;
}